

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O2

char * QScrollerPrivate::stateName(State state)

{
  if (state < 4) {
    return &DAT_0067d9dc + *(int *)(&DAT_0067d9dc + (ulong)state * 4);
  }
  return "(invalid)";
}

Assistant:

const char *QScrollerPrivate::stateName(QScroller::State state)
{
    switch (state) {
    case QScroller::Inactive:  return "inactive";
    case QScroller::Pressed:   return "pressed";
    case QScroller::Dragging:  return "dragging";
    case QScroller::Scrolling: return "scrolling";
    default:                   return "(invalid)";
    }
}